

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image-util.cc
# Opt level: O0

float tinyusdz::detail::Rec709ToLinear(uint8_t v)

{
  double dVar1;
  undefined4 local_14;
  float L;
  float V;
  uint8_t v_local;
  
  local_14 = (float)v / 255.0;
  if (local_14 <= 0.081) {
    dVar1 = ::std::pow((double)(ulong)(uint)((local_14 + 0.099) / 1.099),5.30959450519706e-315);
    local_14 = SUB84(dVar1,0);
  }
  else {
    local_14 = local_14 / 4.5;
  }
  return local_14;
}

Assistant:

float Rec709ToLinear(uint8_t v) {
  float V = v / 255.0f;

  float L;
  if (V > 0.081f) {
    L = V / 4.5f;
  } else {
    L = std::pow((V + 0.099f)/1.099f, (1.0f/0.45f));
  }

  return L;

}